

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_get_Test::~ObjectTest_basic_get_Test(ObjectTest_basic_get_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get) {
	object obj;

	EXPECT_EQ(obj.get<bool>(), bool{});
	EXPECT_EQ(obj.get<signed char>(), signed_char_t{});
	EXPECT_EQ(obj.get<unsigned char>(), unsigned_char_t{});
	EXPECT_EQ(obj.get<short>(), short{});
	EXPECT_EQ(obj.get<int>(), int{});
	EXPECT_EQ(obj.get<long>(), long{});
	EXPECT_EQ(obj.get<long long>(), long_long_t{});
	EXPECT_EQ(obj.get<intmax_t>(), intmax_t{});
	EXPECT_EQ(obj.get<float>(), float{});
	EXPECT_EQ(obj.get<double>(), double{});
	EXPECT_EQ(obj.get<long double>(), long_double_t{});
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	EXPECT_TRUE(obj.get<object::array_type>().empty());
	EXPECT_TRUE(obj.get<object::map_type>().empty());
}